

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Version::MergePartialFromCodedStream
          (Version *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  bool bVar4;
  uint32 uVar5;
  int iVar6;
  UnknownFieldSet *unknown_fields;
  char cVar7;
  uint tag;
  ulong uVar8;
  
  this_00 = &this->suffix_;
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_001fbb46;
      input->buffer_ = pbVar2 + 1;
      uVar8 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_001fbb46:
      uVar5 = io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar8 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar5 | uVar8;
    }
    tag = (uint)uVar8;
    if ((uVar8 & 0x100000000) == 0) goto switchD_001fbbc9_default;
    cVar7 = (char)uVar8;
    switch((uint)(uVar8 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar7 != '\b') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar8 = (ulong)bVar1;
        uVar5 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_001fbcf6;
        input->buffer_ = pbVar2 + 1;
        bVar4 = true;
      }
      else {
        uVar5 = 0;
LAB_001fbcf6:
        uVar8 = io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
        bVar4 = -1 < (long)uVar8;
      }
      iVar6 = 6;
      if (bVar4) {
        this->major_ = (int32)uVar8;
        goto LAB_001fbba0;
      }
      goto LAB_001fbba2;
    case 2:
      if (cVar7 == '\x10') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar8 = (ulong)bVar1;
          uVar5 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_001fbd1c;
          input->buffer_ = pbVar2 + 1;
          bVar4 = true;
        }
        else {
          uVar5 = 0;
LAB_001fbd1c:
          uVar8 = io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
          bVar4 = -1 < (long)uVar8;
        }
        iVar6 = 6;
        if (bVar4) {
          this->minor_ = (int32)uVar8;
          goto LAB_001fbba0;
        }
        goto LAB_001fbba2;
      }
      break;
    case 3:
      if (cVar7 != '\x18') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar8 = (ulong)bVar1;
        uVar5 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_001fbcd0;
        input->buffer_ = pbVar2 + 1;
        bVar4 = true;
      }
      else {
        uVar5 = 0;
LAB_001fbcd0:
        uVar8 = io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
        bVar4 = -1 < (long)uVar8;
      }
      iVar6 = 6;
      if (!bVar4) goto LAB_001fbba2;
      this->patch_ = (int32)uVar8;
      goto LAB_001fbba0;
    case 4:
      if (cVar7 == '\"') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        if ((this->suffix_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_00,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        bVar4 = internal::WireFormatLite::ReadBytes(input,this_00->ptr_);
        iVar6 = 6;
        if (bVar4) {
          internal::WireFormatLite::VerifyUtf8String
                    ((this_00->ptr_->_M_dataplus)._M_p,(int)this_00->ptr_->_M_string_length,PARSE,
                     "google.protobuf.compiler.Version.suffix");
          goto LAB_001fbba0;
        }
        goto LAB_001fbba2;
      }
    }
switchD_001fbbc9_default:
    iVar6 = 7;
    if ((tag & 7) != 4 && tag != 0) {
      pvVar3 = (this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_;
      if (((ulong)pvVar3 & 1) == 0) {
        unknown_fields =
             internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
      }
      else {
        unknown_fields = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
      }
      bVar4 = internal::WireFormat::SkipField(input,tag,unknown_fields);
      iVar6 = 6;
      if (bVar4) {
LAB_001fbba0:
        iVar6 = 0;
      }
    }
LAB_001fbba2:
    if (iVar6 != 0) {
      return iVar6 != 6;
    }
  } while( true );
}

Assistant:

bool Version::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.compiler.Version)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional int32 major = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          set_has_major();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &major_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 minor = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_minor();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &minor_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 patch = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_patch();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &patch_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string suffix = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_suffix()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->suffix().data(), this->suffix().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.compiler.Version.suffix");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.compiler.Version)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.compiler.Version)
  return false;
#undef DO_
}